

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::OutputArchive<cereal::PortableBinaryOutputArchive,_1U>::OutputArchive
          (OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *this,
          PortableBinaryOutputArchive *derived)

{
  _func_int **in_RSI;
  OutputArchiveBase *in_RDI;
  
  detail::OutputArchiveBase::OutputArchiveBase(in_RDI);
  in_RDI->_vptr_OutputArchiveBase = (_func_int **)&PTR__OutputArchive_00375718;
  in_RDI[1]._vptr_OutputArchiveBase = in_RSI;
  std::
  unordered_set<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id_hash,_std::equal_to<cereal::traits::detail::base_class_id>,_std::allocator<cereal::traits::detail::base_class_id>_>
  ::unordered_set((unordered_set<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id_hash,_std::equal_to<cereal::traits::detail::base_class_id>,_std::allocator<cereal::traits::detail::base_class_id>_>
                   *)0x1e3180);
  std::
  unordered_map<const_void_*,_unsigned_int,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
  ::unordered_map((unordered_map<const_void_*,_unsigned_int,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                   *)0x1e318d);
  *(undefined4 *)&in_RDI[0x10]._vptr_OutputArchiveBase = 1;
  std::
  unordered_map<const_char_*,_unsigned_int,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<std::pair<const_char_*const,_unsigned_int>_>_>
  ::unordered_map((unordered_map<const_char_*,_unsigned_int,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<std::pair<const_char_*const,_unsigned_int>_>_>
                   *)0x1e31a7);
  *(undefined4 *)&in_RDI[0x18]._vptr_OutputArchiveBase = 1;
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x1e31c1);
  return;
}

Assistant:

OutputArchive(ArchiveType * const derived) : self(derived), itsCurrentPointerId(1), itsCurrentPolymorphicTypeId(1)
      { }